

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  string *local_670;
  string *local_658;
  string *local_640;
  string *local_628;
  string local_408 [8];
  string source_5;
  string source_4;
  string source_3;
  string source_2;
  string source_1;
  string source;
  string local_338 [8];
  string output_block_shader_source [6];
  string local_268 [8];
  string input_block_shader_source [3];
  allocator<char> local_1f9;
  string local_1f8 [8];
  string invalid_uniform_block_shader_source;
  string local_1c8 [8];
  string invalid_output_shader_source [6];
  string local_f8 [8];
  string invalid_input_shader_source [5];
  allocator<char> local_39;
  string local_38 [8];
  string invalid_buffer_shader_source;
  TestShaderType tested_shader_type_local;
  InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  invalid_buffer_shader_source.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,
             "layout(std140) buffer MyBuffer\n{\n    float f;\n    int   i;\n    uint  ui;\n} myBuffers[2][2];\n\nvoid main()\n{\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  invalid_output_shader_source[5].field_2._M_local_buf[10] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"in  float input_variable",
             (allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source[0].field_2._M_local_buf + 8),
             "[2][2];\nout float output_variable",
             (allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source[1].field_2._M_local_buf + 8),
             ";\n\nvoid main()\n{\n    output_variable",
             (allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source[2].field_2._M_local_buf + 8)," = input_variable"
             ,(allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_input_shader_source[3].field_2._M_local_buf + 8),"[0][0];\n",
             (allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xb));
  invalid_output_shader_source[5].field_2._M_local_buf[10] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_output_shader_source[5].field_2._M_local_buf + 0xf));
  invalid_uniform_block_shader_source.field_2._M_local_buf[9] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c8,"out float output_variable",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source[0].field_2._M_local_buf + 8),
             "[2][2];\n\nvoid main()\n{\n    output_variable",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source[1].field_2._M_local_buf + 8),
             "[0][0] = 0.0;\n    output_variable",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source[2].field_2._M_local_buf + 8),
             "[0][1] = 1.0;\n    output_variable",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source[3].field_2._M_local_buf + 8),
             "[1][0] = 2.0;\n    output_variable",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xb));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_output_shader_source[4].field_2._M_local_buf + 8),"[1][1] = 3.0;\n",
             (allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 10));
  invalid_uniform_block_shader_source.field_2._M_local_buf[9] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 10));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(invalid_uniform_block_shader_source.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,
             "layout(std140) uniform MyUniformBlock\n{\n    float f;\n    int   i;\n    uint  ui;\n} myUniformBlocks[2][2];\n\nvoid main()\n{\n"
             ,&local_1f9);
  std::allocator<char>::~allocator(&local_1f9);
  output_block_shader_source[5].field_2._M_local_buf[0xc] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_268,"in  InBlock {\n    float input_variable;\n} in_block",
             (allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input_block_shader_source[0].field_2._M_local_buf + 8),
             "[2][2];\nout float output_variable;\n\nvoid main()\n{\n    output_variable = in_block"
             ,(allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input_block_shader_source[1].field_2._M_local_buf + 8),
             "[0][0].input_variable;\n",
             (allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xd));
  output_block_shader_source[5].field_2._M_local_buf[0xc] = '\0';
  std::allocator<char>::~allocator
            ((allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator
            ((allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(output_block_shader_source[5].field_2._M_local_buf + 0xf));
  source.field_2._M_local_buf[9] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"out OutBlock {\n    float output_variable;\n} out_block",
             (allocator<char> *)(source.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source[0].field_2._M_local_buf + 8),
             "[2][2];\n\nvoid main()\n{\n    out_block",
             (allocator<char> *)(source.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source[1].field_2._M_local_buf + 8),
             "[0][0].output_variable = 0.0;\n    out_block",
             (allocator<char> *)(source.field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source[2].field_2._M_local_buf + 8),
             "[0][1].output_variable = 1.0;\n    out_block",
             (allocator<char> *)(source.field_2._M_local_buf + 0xc));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source[3].field_2._M_local_buf + 8),
             "[1][0].output_variable = 2.0;\n    out_block",
             (allocator<char> *)(source.field_2._M_local_buf + 0xb));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(output_block_shader_source[4].field_2._M_local_buf + 8),
             "[1][1].output_variable = 3.0;\n",(allocator<char> *)(source.field_2._M_local_buf + 10)
            );
  source.field_2._M_local_buf[9] = '\0';
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 10));
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(source_1.field_2._M_local_buf + 8),local_38);
  switch(invalid_buffer_shader_source.field_2._12_4_) {
  case 0:
    break;
  case 1:
    std::__cxx11::string::operator+=
              ((string *)(source_1.field_2._M_local_buf + 8),"\n\tgl_Position = vec4(0.0);\n");
    break;
  case 2:
    break;
  case 3:
    std::__cxx11::string::operator+=
              ((string *)(source_1.field_2._M_local_buf + 8),(string *)emit_quad_abi_cxx11_);
    break;
  case 4:
    std::__cxx11::string::operator+=
              ((string *)(source_1.field_2._M_local_buf + 8),(string *)set_tesseation_abi_cxx11_);
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1e99);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=
            ((string *)(source_1.field_2._M_local_buf + 8),(string *)shader_end_abi_cxx11_);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[8])
            (this,(ulong)(uint)invalid_buffer_shader_source.field_2._12_4_,
             (undefined1 *)((long)&source_1.field_2 + 8));
  std::__cxx11::string::~string((string *)(source_1.field_2._M_local_buf + 8));
  if (invalid_buffer_shader_source.field_2._12_4_ != 2) {
    std::__cxx11::string::string((string *)(source_2.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)(source_2.field_2._M_local_buf + 8),local_f8);
    if (((invalid_buffer_shader_source.field_2._12_4_ == 3) ||
        (invalid_buffer_shader_source.field_2._12_4_ == 4)) ||
       (invalid_buffer_shader_source.field_2._12_4_ == 5)) {
      std::__cxx11::string::operator+=((string *)(source_2.field_2._M_local_buf + 8),"[]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_2.field_2._M_local_buf + 8),
               (string *)(invalid_input_shader_source[0].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)(source_2.field_2._M_local_buf + 8),"[]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_2.field_2._M_local_buf + 8),
               (string *)(invalid_input_shader_source[1].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=
                ((string *)(source_2.field_2._M_local_buf + 8),"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_2.field_2._M_local_buf + 8),
               (string *)(invalid_input_shader_source[2].field_2._M_local_buf + 8));
    if ((invalid_buffer_shader_source.field_2._12_4_ == 3) ||
       (invalid_buffer_shader_source.field_2._12_4_ == 5)) {
      std::__cxx11::string::operator+=((string *)(source_2.field_2._M_local_buf + 8),"[0]");
    }
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=
                ((string *)(source_2.field_2._M_local_buf + 8),"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_2.field_2._M_local_buf + 8),
               (string *)(invalid_input_shader_source[3].field_2._M_local_buf + 8));
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=
                ((string *)(source_2.field_2._M_local_buf + 8),"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=
                ((string *)(source_2.field_2._M_local_buf + 8),(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=
                ((string *)(source_2.field_2._M_local_buf + 8),(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1ec9);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=
              ((string *)(source_2.field_2._M_local_buf + 8),(string *)shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])
              (this,(ulong)(uint)invalid_buffer_shader_source.field_2._12_4_,
               (undefined1 *)((long)&source_2.field_2 + 8));
    std::__cxx11::string::~string((string *)(source_2.field_2._M_local_buf + 8));
  }
  if (invalid_buffer_shader_source.field_2._12_4_ != 2) {
    std::__cxx11::string::string((string *)(source_3.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)(source_3.field_2._M_local_buf + 8),local_1c8);
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=((string *)(source_3.field_2._M_local_buf + 8),"[]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_3.field_2._M_local_buf + 8),
               (string *)(invalid_output_shader_source[0].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=
                ((string *)(source_3.field_2._M_local_buf + 8),"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_3.field_2._M_local_buf + 8),
               (string *)(invalid_output_shader_source[1].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=
                ((string *)(source_3.field_2._M_local_buf + 8),"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_3.field_2._M_local_buf + 8),
               (string *)(invalid_output_shader_source[2].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=
                ((string *)(source_3.field_2._M_local_buf + 8),"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_3.field_2._M_local_buf + 8),
               (string *)(invalid_output_shader_source[3].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=
                ((string *)(source_3.field_2._M_local_buf + 8),"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_3.field_2._M_local_buf + 8),
               (string *)(invalid_output_shader_source[4].field_2._M_local_buf + 8));
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=
                ((string *)(source_3.field_2._M_local_buf + 8),"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=
                ((string *)(source_3.field_2._M_local_buf + 8),(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=
                ((string *)(source_3.field_2._M_local_buf + 8),(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1ef8);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=
              ((string *)(source_3.field_2._M_local_buf + 8),(string *)shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])
              (this,(ulong)(uint)invalid_buffer_shader_source.field_2._12_4_,
               (undefined1 *)((long)&source_3.field_2 + 8));
    std::__cxx11::string::~string((string *)(source_3.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string((string *)(source_4.field_2._M_local_buf + 8),local_1f8);
  switch(invalid_buffer_shader_source.field_2._12_4_) {
  case 0:
    break;
  case 1:
    std::__cxx11::string::operator+=
              ((string *)(source_4.field_2._M_local_buf + 8),"\n\tgl_Position = vec4(0.0);\n");
    break;
  case 2:
    break;
  case 3:
    std::__cxx11::string::operator+=
              ((string *)(source_4.field_2._M_local_buf + 8),(string *)emit_quad_abi_cxx11_);
    break;
  case 4:
    std::__cxx11::string::operator+=
              ((string *)(source_4.field_2._M_local_buf + 8),(string *)set_tesseation_abi_cxx11_);
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1f01);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=
            ((string *)(source_4.field_2._M_local_buf + 8),(string *)shader_end_abi_cxx11_);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[8])
            (this,(ulong)(uint)invalid_buffer_shader_source.field_2._12_4_,
             (undefined1 *)((long)&source_4.field_2 + 8));
  std::__cxx11::string::~string((string *)(source_4.field_2._M_local_buf + 8));
  if ((invalid_buffer_shader_source.field_2._12_4_ != 1) &&
     (invalid_buffer_shader_source.field_2._12_4_ != 2)) {
    std::__cxx11::string::string((string *)(source_5.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)(source_5.field_2._M_local_buf + 8),local_268);
    if ((invalid_buffer_shader_source.field_2._12_4_ == 3) ||
       ((invalid_buffer_shader_source.field_2._12_4_ == 4 ||
        (invalid_buffer_shader_source.field_2._12_4_ == 5)))) {
      std::__cxx11::string::operator+=((string *)(source_5.field_2._M_local_buf + 8),"[]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_5.field_2._M_local_buf + 8),
               (string *)(input_block_shader_source[0].field_2._M_local_buf + 8));
    if (((invalid_buffer_shader_source.field_2._12_4_ == 3) ||
        (invalid_buffer_shader_source.field_2._12_4_ == 4)) ||
       (invalid_buffer_shader_source.field_2._12_4_ == 5)) {
      std::__cxx11::string::operator+=((string *)(source_5.field_2._M_local_buf + 8),"[0]");
    }
    std::__cxx11::string::operator+=
              ((string *)(source_5.field_2._M_local_buf + 8),
               (string *)(input_block_shader_source[1].field_2._M_local_buf + 8));
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=
                ((string *)(source_5.field_2._M_local_buf + 8),"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=
                ((string *)(source_5.field_2._M_local_buf + 8),(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=
                ((string *)(source_5.field_2._M_local_buf + 8),(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1f20);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=
              ((string *)(source_5.field_2._M_local_buf + 8),(string *)shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])
              (this,(ulong)(uint)invalid_buffer_shader_source.field_2._12_4_,
               (undefined1 *)((long)&source_5.field_2 + 8));
    std::__cxx11::string::~string((string *)(source_5.field_2._M_local_buf + 8));
  }
  if ((invalid_buffer_shader_source.field_2._12_4_ != 0) &&
     (invalid_buffer_shader_source.field_2._12_4_ != 2)) {
    std::__cxx11::string::string(local_408);
    std::__cxx11::string::operator=(local_408,local_338);
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=(local_408,"[]");
    }
    std::__cxx11::string::operator+=
              (local_408,(string *)(output_block_shader_source[0].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=(local_408,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              (local_408,(string *)(output_block_shader_source[1].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=(local_408,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              (local_408,(string *)(output_block_shader_source[2].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=(local_408,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              (local_408,(string *)(output_block_shader_source[3].field_2._M_local_buf + 8));
    if (invalid_buffer_shader_source.field_2._12_4_ == 4) {
      std::__cxx11::string::operator+=(local_408,"[gl_InvocationID]");
    }
    std::__cxx11::string::operator+=
              (local_408,(string *)(output_block_shader_source[4].field_2._M_local_buf + 8));
    switch(invalid_buffer_shader_source.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=(local_408,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=(local_408,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=(local_408,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1f51);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=(local_408,(string *)shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)(uint)invalid_buffer_shader_source.field_2._12_4_,local_408);
    std::__cxx11::string::~string(local_408);
  }
  local_628 = (string *)(output_block_shader_source[5].field_2._M_local_buf + 8);
  do {
    local_628 = local_628 + -0x20;
    std::__cxx11::string::~string(local_628);
  } while (local_628 != local_338);
  local_640 = (string *)(input_block_shader_source[2].field_2._M_local_buf + 8);
  do {
    local_640 = local_640 + -0x20;
    std::__cxx11::string::~string(local_640);
  } while (local_640 != local_268);
  std::__cxx11::string::~string(local_1f8);
  local_658 = (string *)(invalid_output_shader_source[5].field_2._M_local_buf + 8);
  do {
    local_658 = local_658 + -0x20;
    std::__cxx11::string::~string(local_658);
  } while (local_658 != local_1c8);
  local_670 = (string *)(invalid_input_shader_source[4].field_2._M_local_buf + 8);
  do {
    local_670 = local_670 + -0x20;
    std::__cxx11::string::~string(local_670);
  } while (local_670 != local_f8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void InteractionInterfaceArrays<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	/* Shader source with invalid buffer (buffer cannot be of arrays of arrays type). */
	const std::string invalid_buffer_shader_source = "layout(std140) buffer MyBuffer\n"
													 "{\n"
													 "    float f;\n"
													 "    int   i;\n"
													 "    uint  ui;\n"
													 "} myBuffers[2][2];\n\n"
													 "void main()\n"
													 "{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string invalid_input_shader_source[] = { "in  float input_variable", "[2][2];\n"
																					"out float output_variable",
														";\n\n"
														"void main()\n"
														"{\n"
														"    output_variable",
														" = input_variable", "[0][0];\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string invalid_output_shader_source[] = { "out float output_variable", "[2][2];\n\n"
																					  "void main()\n"
																					  "{\n"
																					  "    output_variable",
														 "[0][0] = 0.0;\n"
														 "    output_variable",
														 "[0][1] = 1.0;\n"
														 "    output_variable",
														 "[1][0] = 2.0;\n"
														 "    output_variable",
														 "[1][1] = 3.0;\n" };
	/* Shader source with invalid uniform block (uniform block cannot be of arrays of arrays type). */
	const std::string invalid_uniform_block_shader_source = "layout(std140) uniform MyUniformBlock\n"
															"{\n"
															"    float f;\n"
															"    int   i;\n"
															"    uint  ui;\n"
															"} myUniformBlocks[2][2];\n\n"
															"void main()\n"
															"{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string input_block_shader_source[] = { "in  InBlock {\n"
													  "    float input_variable;\n"
													  "} in_block",

													  "[2][2];\n"
													  "out float output_variable;\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "    output_variable = in_block",
													  "[0][0].input_variable;\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string output_block_shader_source[] = { "out OutBlock {\n"
													   "    float output_variable;\n"
													   "} out_block",
													   "[2][2];\n"
													   "\n"
													   "void main()\n"
													   "{\n"
													   "    out_block",
													   "[0][0].output_variable = 0.0;\n"
													   "    out_block",
													   "[0][1].output_variable = 1.0;\n"
													   "    out_block",
													   "[1][0].output_variable = 2.0;\n"
													   "    out_block",
													   "[1][1].output_variable = 3.0;\n" };

	/* Verify that buffer arrays of arrays type is rejected. */
	{
		std::string source = invalid_buffer_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that INPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_input_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += invalid_input_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_input_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[3];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[4];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that OUTPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_output_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_output_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that uniform block arrays of arrays type is rejected. */
	{
		std::string source = invalid_uniform_block_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of input blocks are accepted */
	if ((TestCaseBase<API>::VERTEX_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source += input_block_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += input_block_shader_source[1];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		source += input_block_shader_source[2];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of output blocks are accepted */
	if ((TestCaseBase<API>::FRAGMENT_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source = output_block_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += output_block_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}
}